

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryUnorderedTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>::
TryRegisterDeletedPropertyIndex
          (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *object,int propertyIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x33,"(object)","object");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = IsReusablePropertyIndex(this,propertyIndex);
  if (bVar2) {
    DynamicTypeHandler::SetSlotUnchecked
              (object,propertyIndex,(Var)((ulong)(uint)this->deletedPropertyIndex | 0x1000000000000)
              );
    this->deletedPropertyIndex = propertyIndex;
  }
  return bVar2;
}

Assistant:

bool SimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryRegisterDeletedPropertyIndex(
        DynamicObject *const object,
        const TPropertyIndex propertyIndex)
    {
        Assert(object);

        if(!IsReusablePropertyIndex(propertyIndex))
        {
            return false;
        }

        Assert(!TaggedInt::IsOverflow(PropertyIndexRanges<TPropertyIndex>::NoSlots)); // the last deleted property's slot in the chain is going to store NoSlots as a tagged int

        this->SetSlotUnchecked(object, propertyIndex, TaggedInt::ToVarUnchecked(deletedPropertyIndex));
        deletedPropertyIndex = propertyIndex;
        return true;
    }